

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O3

void __thiscall HostUI::set_palette(HostUI *this,RGBA *palette)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  GLfloat p [16];
  GLfloat local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  uVar1 = *palette;
  uVar2 = palette[1];
  uVar3 = palette[2];
  uVar4 = palette[3];
  auVar5._0_4_ = (float)(uVar1 & 0xff);
  auVar5._4_4_ = (float)(uVar2 & 0xff);
  auVar5._8_4_ = (float)(uVar3 & 0xff);
  auVar5._12_4_ = (float)(uVar4 & 0xff);
  auVar5 = divps(auVar5,_DAT_001bbf10);
  auVar6._0_4_ = (float)(uVar1 >> 8 & 0xff);
  auVar6._4_4_ = (float)(uVar2 >> 8 & 0xff);
  auVar6._8_4_ = (float)(uVar3 >> 8 & 0xff);
  auVar6._12_4_ = (float)(uVar4 >> 8 & 0xff);
  auVar6 = divps(auVar6,_DAT_001bbf10);
  auVar7._0_4_ = (float)(uVar1 >> 0x10 & 0xff);
  auVar7._4_4_ = (float)(uVar2 >> 0x10 & 0xff);
  auVar7._8_4_ = (float)(uVar3 >> 0x10 & 0xff);
  auVar7._12_4_ = (float)(uVar4 >> 0x10 & 0xff);
  auVar7 = divps(auVar7,_DAT_001bbf10);
  uStack_54 = auVar6._0_4_;
  uStack_44 = auVar6._4_4_;
  uStack_34 = auVar6._8_4_;
  uStack_24 = auVar6._12_4_;
  uStack_50 = auVar7._0_4_;
  uStack_40 = auVar7._4_4_;
  uStack_30 = auVar7._8_4_;
  uStack_20 = auVar7._12_4_;
  local_58 = auVar5._0_4_;
  local_48 = auVar5._4_4_;
  local_38 = auVar5._8_4_;
  local_28 = auVar5._12_4_;
  uStack_1c = 0x3f800000;
  uStack_2c = 0x3f800000;
  uStack_3c = 0x3f800000;
  uStack_4c = 0x3f800000;
  (*glUseProgram)(this->program);
  (*glUniform4fv)(this->uPalette,4,&local_58);
  return;
}

Assistant:

void HostUI::set_palette(RGBA palette[4]) {
  GLfloat p[16];
  for (int i = 0; i < 4; ++i) {
    p[i * 4 + 0] = ((palette[i] >> 0) & 255) / 255.0f;
    p[i * 4 + 1] = ((palette[i] >> 8) & 255) / 255.0f;
    p[i * 4 + 2] = ((palette[i] >> 16) & 255) / 255.0f;
    p[i * 4 + 3] = 1.0f;
  }
  glUseProgram(program);
  glUniform4fv(uPalette, 4, p);
}